

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_tpl_auto_escape.cc
# Opt level: O2

bool DiffTemplates(char *filename_a,char *filename_b,Strip strip)

{
  pointer __rhs;
  string *__lhs;
  bool bVar1;
  long lVar2;
  pointer __lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_01;
  uint uVar3;
  uint local_ac;
  vector<VariableAndMod,_std::allocator<VariableAndMod>_> vars_and_mods_b;
  vector<VariableAndMod,_std::allocator<VariableAndMod>_> vars_and_mods_a;
  string local_70;
  string local_50;
  
  vars_and_mods_a.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vars_and_mods_a.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vars_and_mods_a.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vars_and_mods_b.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vars_and_mods_b.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vars_and_mods_b.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = LoadVariables(filename_a,strip,&vars_and_mods_a);
  if ((bVar1) && (bVar1 = LoadVariables(filename_b,strip,&vars_and_mods_b), bVar1)) {
    lVar2 = (long)vars_and_mods_a.
                  super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vars_and_mods_a.
                  super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                  super__Vector_impl_data._M_start >> 6;
    if (lVar2 != (long)vars_and_mods_b.
                       super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)vars_and_mods_b.
                       super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                       super__Vector_impl_data._M_start >> 6) {
      LogPrintf(4,"Templates differ: %s [%d vars] vs. %s [%d vars].\n",filename_a,lVar2,filename_b);
    }
    local_ac = 0;
    uVar3 = 0;
    __lhs_00 = vars_and_mods_a.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
               _M_impl.super__Vector_impl_data._M_start;
    for (__lhs_01 = &(vars_and_mods_b.
                      super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                      super__Vector_impl_data._M_start)->modifiers;
        (__lhs_00 !=
         vars_and_mods_a.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl
         .super__Vector_impl_data._M_finish &&
        (__rhs = (pointer)(__lhs_01 + -1),
        __rhs != vars_and_mods_b.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>
                 ._M_impl.super__Vector_impl_data._M_finish)); __lhs_01 = __lhs_01 + 2) {
      bVar1 = std::operator!=(&__lhs_00->variable_name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs);
      if (bVar1) {
        LogPrintf(4,"Variable name mismatch: %s vs. %s\n",(__lhs_00->variable_name)._M_dataplus._M_p
                  ,(__rhs->variable_name)._M_dataplus._M_p);
      }
      __lhs = &__lhs_00->modifiers;
      bVar1 = std::operator==(__lhs,"");
      if ((bVar1) || (bVar1 = std::operator==(__lhs_01,""), bVar1)) {
        uVar3 = uVar3 + 1;
      }
      else {
        bVar1 = std::operator!=(__lhs,__lhs_01);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_70,(string *)__lhs);
          std::__cxx11::string::string((string *)&local_50,(string *)__lhs_01);
          bVar1 = SuppressLameDiff(&local_70,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          if (!bVar1) {
            local_ac = local_ac + 1;
            LogPrintf(1,"Difference for variable %s -- %s vs. %s\n",
                      (__lhs_00->variable_name)._M_dataplus._M_p,
                      (__lhs_00->modifiers)._M_dataplus._M_p,(__lhs_01->_M_dataplus)._M_p);
          }
        }
      }
      __lhs_00 = __lhs_00 + 1;
    }
    LogPrintf(0,"Variables Found: Total=%d; Diffs=%d; NoMods=%d\n",
              (long)vars_and_mods_a.
                    super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)vars_and_mods_a.
                    super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                    super__Vector_impl_data._M_start >> 6,(ulong)local_ac,(ulong)uVar3);
    bVar1 = local_ac == 0;
  }
  else {
    bVar1 = false;
  }
  std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::~vector(&vars_and_mods_b);
  std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::~vector(&vars_and_mods_a);
  return bVar1;
}

Assistant:

bool DiffTemplates(const char* filename_a, const char* filename_b,
                   Strip strip) {
  vector<VariableAndMod> vars_and_mods_a, vars_and_mods_b;

  if (!LoadVariables(filename_a, strip, vars_and_mods_a) ||
      !LoadVariables(filename_b, strip, vars_and_mods_b))
    return false;

  if (vars_and_mods_a.size() != vars_and_mods_b.size())
    LogPrintf(LOG_FATAL, "Templates differ: %s [%d vars] vs. %s [%d vars].\n",
              filename_a, vars_and_mods_a.size(),
              filename_b, vars_and_mods_b.size());

  int mismatch_count = 0;      // How many differences there were.
  int no_modifiers_count = 0;  // How many variables without modifiers.
  VariableAndMods::const_iterator iter_a, iter_b;
  for (iter_a = vars_and_mods_a.begin(), iter_b = vars_and_mods_b.begin();
       iter_a != vars_and_mods_a.end() && iter_b != vars_and_mods_b.end();
       ++iter_a, ++iter_b) {
    // The templates have different variables, we fail!
    if (iter_a->variable_name != iter_b->variable_name)
      LogPrintf(LOG_FATAL, "Variable name mismatch: %s vs. %s\n",
                iter_a->variable_name.c_str(),
                iter_b->variable_name.c_str());
    // Variables without modifiers are ignored from the diff. They simply
    // get counted and the count is shown in verbose logging/
    if (iter_a->modifiers == "" || iter_b->modifiers == "") {
      no_modifiers_count++;
    } else {
      if (iter_a->modifiers != iter_b->modifiers &&
          !SuppressLameDiff(iter_a->modifiers, iter_b->modifiers)) {
        mismatch_count++;
        LogPrintf(LOG_INFO, "Difference for variable %s -- %s vs. %s\n",
                  iter_a->variable_name.c_str(),
                  iter_a->modifiers.c_str(), iter_b->modifiers.c_str());
      }
    }
  }

  LogPrintf(LOG_VERBOSE, "Variables Found: Total=%d; Diffs=%d; NoMods=%d\n",
            vars_and_mods_a.size(), mismatch_count, no_modifiers_count);

  return (mismatch_count == 0);
}